

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O0

string_view __thiscall
ResolveGenericCommand::getHelp(ResolveGenericCommand *this,string_view parameters)

{
  string_view sVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  ResolveGenericCommand *this_local;
  string_view parameters_local;
  char *local_10;
  
  bVar3 = sv("hostname",8);
  bVar2 = jessilib::equalsi<char,char>(parameters,bVar3);
  if (!bVar2) {
    bVar3 = sv("host",4);
    bVar2 = jessilib::equalsi<char,char>(parameters,bVar3);
    if (!bVar2) {
      bVar3 = sv("ip",2);
      bVar2 = jessilib::equalsi<char,char>(parameters,bVar3);
      if (bVar2) {
        parameters_local._M_str = (char *)0x4a;
        local_10 = "Reverse-resolves an IP address to a hostname. Syntax: resolve ip <address>";
      }
      else {
        parameters_local._M_str = (char *)0x4b;
        local_10 = "Resolves an IP address or hostname. Syntax: resolve <hostname|ip> <address>";
      }
      goto LAB_00108e3d;
    }
  }
  parameters_local._M_str = (char *)0x48;
  local_10 = "Resolves a hostname to an IP address. Syntax: resolve hostname <address>";
LAB_00108e3d:
  sVar1._M_str = local_10;
  sVar1._M_len = (size_t)parameters_local._M_str;
  return sVar1;
}

Assistant:

std::string_view ResolveGenericCommand::getHelp(std::string_view parameters)
{
	static constexpr std::string_view defaultHelp = "Resolves an IP address or hostname. Syntax: resolve <hostname|ip> <address>"sv;
	static constexpr std::string_view hostHelp = "Resolves a hostname to an IP address. Syntax: resolve hostname <address>"sv;
	static constexpr std::string_view ipHelp = "Reverse-resolves an IP address to a hostname. Syntax: resolve ip <address>"sv;

	if (jessilib::equalsi(parameters, "hostname"sv) || jessilib::equalsi(parameters, "host"sv))
		return hostHelp;
	if (jessilib::equalsi(parameters, "ip"sv))
		return ipHelp;

	return defaultHelp;
}